

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLin>::
operator()(LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLin>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  ImVec2 IVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXsYs<unsigned_long_long> *pGVar8;
  ImDrawVert *pIVar9;
  ImDrawIdx *pIVar10;
  ImDrawIdx IVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  pGVar8 = this->Getter;
  iVar5 = pGVar8->Count;
  lVar12 = (long)(((pGVar8->Offset + prim + 1) % iVar5 + iVar5) % iVar5) * (long)pGVar8->Stride;
  uVar2 = *(unsigned_long_long *)((long)pGVar8->Xs + lVar12);
  uVar3 = *(unsigned_long_long *)((long)pGVar8->Ys + lVar12);
  iVar5 = this->Transformer->YAxis;
  fVar17 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) -
                   (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                  (double)GImPlot->PixelRange[iVar5].Min.x);
  fVar18 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) -
                   GImPlot->CurrentPlot->YAxis[iVar5].Range.Min) * GImPlot->My[iVar5] +
                  (double)GImPlot->PixelRange[iVar5].Min.y);
  fVar16 = (this->P1).x;
  fVar19 = (this->P1).y;
  fVar15 = fVar19;
  if (fVar18 <= fVar19) {
    fVar15 = fVar18;
  }
  bVar13 = false;
  if ((fVar15 < (cull_rect->Max).y) &&
     (fVar15 = (float)(-(uint)(fVar18 <= fVar19) & (uint)fVar19 |
                      ~-(uint)(fVar18 <= fVar19) & (uint)fVar18), pfVar1 = &(cull_rect->Min).y,
     bVar13 = false, *pfVar1 <= fVar15 && fVar15 != *pfVar1)) {
    fVar15 = fVar16;
    if (fVar17 <= fVar16) {
      fVar15 = fVar17;
    }
    if (fVar15 < (cull_rect->Max).x) {
      fVar15 = (float)(~-(uint)(fVar17 <= fVar16) & (uint)fVar17 |
                      -(uint)(fVar17 <= fVar16) & (uint)fVar16);
      bVar13 = (cull_rect->Min).x <= fVar15 && fVar15 != (cull_rect->Min).x;
    }
  }
  if (bVar13 != false) {
    fVar15 = this->Weight;
    IVar6 = this->Col;
    IVar4 = *uv;
    fVar16 = fVar17 - fVar16;
    fVar19 = fVar18 - fVar19;
    fVar14 = fVar16 * fVar16 + fVar19 * fVar19;
    if (0.0 < fVar14) {
      if (fVar14 < 0.0) {
        fVar14 = sqrtf(fVar14);
      }
      else {
        fVar14 = SQRT(fVar14);
      }
      fVar16 = fVar16 * (1.0 / fVar14);
      fVar19 = fVar19 * (1.0 / fVar14);
    }
    fVar15 = fVar15 * 0.5;
    fVar16 = fVar16 * fVar15;
    fVar15 = fVar15 * fVar19;
    pIVar9 = DrawList->_VtxWritePtr;
    (pIVar9->pos).x = (this->P1).x + fVar15;
    (pIVar9->pos).y = (this->P1).y - fVar16;
    pIVar9->uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar6;
    pIVar9[1].pos.x = fVar15 + fVar17;
    pIVar9[1].pos.y = fVar18 - fVar16;
    pIVar9[1].uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar6;
    pIVar9[2].pos.x = fVar17 - fVar15;
    pIVar9[2].pos.y = fVar16 + fVar18;
    pIVar9[2].uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar6;
    pIVar9[3].pos.x = (this->P1).x - fVar15;
    pIVar9[3].pos.y = fVar16 + (this->P1).y;
    pIVar9[3].uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar10 = DrawList->_IdxWritePtr;
    IVar11 = (ImDrawIdx)uVar7;
    *pIVar10 = IVar11;
    pIVar10[1] = IVar11 + 1;
    pIVar10[2] = IVar11 + 2;
    pIVar10[3] = IVar11;
    pIVar10[4] = IVar11 + 2;
    pIVar10[5] = IVar11 + 3;
    DrawList->_IdxWritePtr = pIVar10 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  IVar4.y = fVar18;
  IVar4.x = fVar17;
  this->P1 = IVar4;
  return bVar13;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }